

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yacclab_tests.h
# Opt level: O2

void __thiscall
YacclabTests::YacclabTests
          (YacclabTests *this,ModeConfig *mode_cfg,GlobalConfig *glob_cfg,error_code *ec)

{
  _Rb_tree_header *p_Var1;
  allocator local_41;
  string local_40;
  
  std::__cxx11::string::string((string *)&local_40,"",&local_41);
  OutputBox::OutputBox(&this->ob_,&local_40,0x50,2);
  std::__cxx11::string::~string((string *)&local_40);
  this->ec_ = ec;
  this->mode_cfg_ = mode_cfg;
  this->glob_cfg_ = glob_cfg;
  filesystem::operator/(&this->output_path,&glob_cfg->glob_output_path,&mode_cfg->mode_output_path);
  cv::Mat_<double>::Mat_(&this->average_results_);
  cv::Mat_<double>::Mat_(&this->density_results_);
  p_Var1 = &(this->granularity_results_)._M_t._M_impl.super__Rb_tree_header;
  (this->granularity_results_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->granularity_results_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->granularity_results_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->granularity_results_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->granularity_results_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->average_ws_results_)._M_t._M_impl.super__Rb_tree_header;
  (this->average_ws_results_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->average_ws_results_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->average_ws_results_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->average_ws_results_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->average_ws_results_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->memory_accesses_)._M_t._M_impl.super__Rb_tree_header;
  (this->memory_accesses_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->memory_accesses_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->memory_accesses_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header
  ;
  (this->memory_accesses_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->memory_accesses_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  return;
}

Assistant:

YacclabTests(ModeConfig &mode_cfg, GlobalConfig &glob_cfg, std::error_code &ec) : 
		ec_(ec), mode_cfg_(mode_cfg), glob_cfg_(glob_cfg), output_path(glob_cfg.glob_output_path / mode_cfg.mode_output_path) {}